

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

bool __thiscall cmCTestRunProcess::StartProcess(cmCTestRunProcess *this)

{
  cmsysProcess *pcVar1;
  bool bVar2;
  int iVar3;
  reference command;
  ulong uVar4;
  char *dir;
  bool local_7d;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_60;
  value_type local_58 [3];
  value_type local_40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  iterator i;
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  cmCTestRunProcess *this_local;
  
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&i);
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->CommandLineStrings);
  while( true ) {
    local_38._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->CommandLineStrings);
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_30);
    local_40 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&i,&local_40);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_30);
  }
  local_58[0] = (value_type)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&i,local_58);
  pcVar1 = this->Process;
  local_60._M_current =
       (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)&i);
  command = __gnu_cxx::
            __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
            ::operator*(&local_60);
  cmsysProcess_SetCommand(pcVar1,command);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar1 = this->Process;
    dir = (char *)std::__cxx11::string::c_str();
    cmsysProcess_SetWorkingDirectory(pcVar1,dir);
  }
  cmsysProcess_SetOption(this->Process,0,1);
  if ((this->TimeOut != -1.0) || (NAN(this->TimeOut))) {
    cmsysProcess_SetTimeout(this->Process,this->TimeOut);
  }
  cmsysProcess_Execute(this->Process);
  iVar3 = cmsysProcess_GetState(this->Process);
  this->PipeState = iVar3;
  local_7d = true;
  if (this->PipeState != 3) {
    local_7d = this->PipeState == 4;
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&i);
  return local_7d;
}

Assistant:

bool StartProcess()
  {
    std::vector<const char*> args;
    for (std::vector<std::string>::iterator i =
           this->CommandLineStrings.begin();
         i != this->CommandLineStrings.end(); ++i) {
      args.push_back(i->c_str());
    }
    args.push_back(CM_NULLPTR); // null terminate
    cmsysProcess_SetCommand(this->Process, &*args.begin());
    if (!this->WorkingDirectory.empty()) {
      cmsysProcess_SetWorkingDirectory(this->Process,
                                       this->WorkingDirectory.c_str());
    }

    cmsysProcess_SetOption(this->Process, cmsysProcess_Option_HideWindow, 1);
    if (this->TimeOut != -1) {
      cmsysProcess_SetTimeout(this->Process, this->TimeOut);
    }
    cmsysProcess_Execute(this->Process);
    this->PipeState = cmsysProcess_GetState(this->Process);
    // if the process is running or exited return true
    return this->PipeState == cmsysProcess_State_Executing ||
      this->PipeState == cmsysProcess_State_Exited;
  }